

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

ikey_type<unodb::olc_db<unodb::key_view,_unodb::value_view>_> __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::to_ikey(tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          *this,key_type key)

{
  long in_RCX;
  long in_FS_OFFSET;
  shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_> sVar1;
  ikey_type<unodb::olc_db<unodb::key_view,_unodb::value_view>_> iVar2;
  __normal_iterator<const_std::byte_*,_std::span<const_std::byte,_18446744073709551615UL>_> local_20
  ;
  long local_18;
  
  local_20._M_current = (byte *)key._M_extent._M_extent_value;
  *(undefined1 *)(in_FS_OFFSET + -0x20) = 1;
  local_18 = in_RCX + (long)local_20._M_current;
  sVar1 = std::
          make_shared<std::vector<std::byte,std::allocator<std::byte>>,__gnu_cxx::__normal_iterator<std::byte_const*,std::span<std::byte_const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<std::byte_const*,std::span<std::byte_const,18446744073709551615ul>>>
                    ((__normal_iterator<const_std::byte_*,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)this,&local_20);
  iVar2.
  super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount = sVar1.
                 super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
  *(undefined1 *)(in_FS_OFFSET + -0x20) = 0;
  iVar2.
  super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ikey_type<unodb::olc_db<unodb::key_view,_unodb::value_view>_>)
         iVar2.
         super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

[[nodiscard]] ikey_type<Db> to_ikey(typename Db::key_type key) const
      noexcept(!std::is_same_v<key_type, unodb::key_view>) {
    if constexpr (std::is_same_v<key_type, unodb::key_view>) {
      // Allocate a vector, make a copy of the key into the vector,
      // and return a shared_ptr to that vector.
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      return std::make_shared<std::vector<std::byte>>(key.begin(), key.end());
    } else {
      return key;  // NOP
    }
  }